

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fAtomicCounterTests.cpp
# Opt level: O3

bool __thiscall
deqp::gles31::Functional::anon_unknown_0::AtomicCounterTest::checkAndLogCallValues
          (AtomicCounterTest *this,TestLog *log,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *increments,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *decrements,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *preGets,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *postGets,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *gets)

{
  int *piVar1;
  Operation OVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  byte bVar6;
  uint uVar7;
  uint uVar8;
  undefined8 in_RAX;
  long *plVar9;
  undefined8 *puVar10;
  pointer puVar11;
  uint uVar12;
  uint uVar13;
  long *plVar14;
  pointer puVar15;
  TestLog *pTVar16;
  ulong *puVar17;
  int iVar18;
  uint uVar19;
  int iVar20;
  ulong uVar21;
  uint uVar22;
  int *piVar23;
  int iVar24;
  int ndx;
  int iVar25;
  long lVar26;
  bool bVar27;
  vector<unsigned_int,_std::allocator<unsigned_int>_> decrementCounts;
  ScopedLogSection valueCheck;
  ScopedLogSection uniquenesCheck_1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> counterDecrements;
  vector<unsigned_int,_std::allocator<unsigned_int>_> counterIncrements;
  vector<unsigned_int,_std::allocator<unsigned_int>_> counterPostGets;
  vector<unsigned_int,_std::allocator<unsigned_int>_> counterPreGets;
  ostringstream s;
  vector<unsigned_int,_std::allocator<unsigned_int>_> counterGets;
  long *local_3f0 [2];
  long local_3e0 [2];
  TestLog *local_3d0;
  long *local_3c8;
  undefined8 local_3c0;
  long local_3b8;
  undefined8 uStack_3b0;
  uint local_3a4;
  long *local_3a0;
  long local_398;
  long local_390;
  long lStack_388;
  long *local_380;
  long local_378;
  long local_370;
  long lStack_368;
  allocator<char> local_359;
  ulong *local_358;
  long local_350;
  ulong local_348;
  long lStack_340;
  long *local_338;
  long local_330;
  long local_328;
  long lStack_320;
  string local_318;
  string local_2f0;
  ScopedLogSection local_2d0;
  long local_2c8;
  TestLog local_2c0;
  long lStack_2b8;
  ulong *local_2b0;
  long local_2a8;
  ulong local_2a0 [2];
  ScopedLogSection local_290;
  long *local_288 [2];
  long local_278 [2];
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_268;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_248;
  uint local_230;
  int local_22c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_228;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_208;
  undefined1 local_1e8 [8];
  _func_int **pp_Stack_1e0;
  pointer local_1d8;
  ios_base local_178 [8];
  ios_base local_170 [264];
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_68;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_50;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_48;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_40;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_38;
  
  iVar18 = (this->m_spec).atomicCounterCount;
  if (iVar18 < 1) {
    bVar6 = 1;
  }
  else {
    local_3a4 = (uint)CONCAT71((int7)((ulong)in_RAX >> 8),1);
    ndx = 0;
    local_3d0 = log;
    local_50 = postGets;
    local_48 = preGets;
    local_40 = decrements;
    local_38 = increments;
    do {
      local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_268.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_268.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_268.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_208.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_208.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_208.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_228.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_228.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_228.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      getCountersValues(&local_248,local_38,ndx,iVar18);
      getCountersValues(&local_268,local_40,ndx,(this->m_spec).atomicCounterCount);
      getCountersValues(&local_208,local_48,ndx,(this->m_spec).atomicCounterCount);
      getCountersValues(&local_228,local_50,ndx,(this->m_spec).atomicCounterCount);
      getCountersValues(&local_68,gets,ndx,(this->m_spec).atomicCounterCount);
      OVar2 = (this->m_spec).operations;
      if (OVar2 == OPERATION_GET) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
        std::ostream::operator<<((MessageBuilder *)local_1e8,ndx);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8);
        std::ios_base::~ios_base(local_178);
        plVar9 = (long *)std::__cxx11::string::replace((ulong)local_3f0,0,(char *)0x0,0x1ab4dd2);
        plVar14 = plVar9 + 2;
        if ((long *)*plVar9 == plVar14) {
          local_328 = *plVar14;
          lStack_320 = plVar9[3];
          local_338 = &local_328;
        }
        else {
          local_328 = *plVar14;
          local_338 = (long *)*plVar9;
        }
        local_330 = plVar9[1];
        *plVar9 = (long)plVar14;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        plVar9 = (long *)std::__cxx11::string::append((char *)&local_338);
        plVar14 = plVar9 + 2;
        if ((long *)*plVar9 == plVar14) {
          local_370 = *plVar14;
          lStack_368 = plVar9[3];
          local_380 = &local_370;
        }
        else {
          local_370 = *plVar14;
          local_380 = (long *)*plVar9;
        }
        local_378 = plVar9[1];
        *plVar9 = (long)plVar14;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_318,(char *)local_380,(allocator<char> *)local_288);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
        std::ostream::operator<<((MessageBuilder *)local_1e8,ndx);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8);
        std::ios_base::~ios_base(local_178);
        puVar10 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)&local_358,0,(char *)0x0,0x1c42f9c);
        local_3c8 = &local_3b8;
        plVar9 = puVar10 + 2;
        if ((long *)*puVar10 == plVar9) {
          local_3b8 = *plVar9;
          uStack_3b0 = puVar10[3];
        }
        else {
          local_3b8 = *plVar9;
          local_3c8 = (long *)*puVar10;
        }
        local_3c0 = puVar10[1];
        *puVar10 = plVar9;
        puVar10[1] = 0;
        *(undefined1 *)(puVar10 + 2) = 0;
        plVar9 = (long *)std::__cxx11::string::append((char *)&local_3c8);
        local_3a0 = &local_390;
        plVar14 = plVar9 + 2;
        if ((long *)*plVar9 == plVar14) {
          local_390 = *plVar14;
          lStack_388 = plVar9[3];
        }
        else {
          local_390 = *plVar14;
          local_3a0 = (long *)*plVar9;
        }
        local_398 = plVar9[1];
        *plVar9 = (long)plVar14;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2f0,(char *)local_3a0,(allocator<char> *)local_1e8);
        tcu::ScopedLogSection::ScopedLogSection(&local_2d0,local_3d0,&local_318,&local_2f0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
          operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
        }
        if (local_3a0 != &local_390) {
          operator_delete(local_3a0,local_390 + 1);
        }
        if (local_3c8 != &local_3b8) {
          operator_delete(local_3c8,local_3b8 + 1);
        }
        if (local_358 != &local_348) {
          operator_delete(local_358,local_348 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_318._M_dataplus._M_p != &local_318.field_2) {
          operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
        }
        if (local_380 != &local_370) {
          operator_delete(local_380,local_370 + 1);
        }
        if (local_338 != &local_328) {
          operator_delete(local_338,local_328 + 1);
        }
        if (local_3f0[0] != local_3e0) {
          operator_delete(local_3f0[0],local_3e0[0] + 1);
        }
        puVar11 = (gets->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        puVar15 = (gets->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                  super__Vector_impl_data._M_finish;
        if ((int)((ulong)((long)puVar15 - (long)puVar11) >> 2) < 1) {
LAB_01430320:
          local_1e8 = (undefined1  [8])local_3d0;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_1e0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pp_Stack_1e0,"All values returned by atomicCounter(counter",0x2c);
          std::ostream::operator<<((ostringstream *)&pp_Stack_1e0,ndx);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pp_Stack_1e0,") match initial value ",0x16);
          std::ostream::_M_insert<unsigned_long>((ulong)&pp_Stack_1e0);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pp_Stack_1e0,".",1);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_1e0);
          std::ios_base::~ios_base(local_170);
        }
        else {
          lVar26 = 0;
          iVar18 = 0;
          do {
            if ((((this->m_spec).useBranches != true) || (puVar11[lVar26] != 0xffffffff)) &&
               (puVar11[lVar26] != (this->m_spec).threadCount * (this->m_spec).callCount + 1U)) {
              if (iVar18 < 0x14) {
                local_1e8 = (undefined1  [8])local_3d0;
                std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_1e0);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&pp_Stack_1e0,"atomicCounter(counter",0x15);
                std::ostream::operator<<((ostringstream *)&pp_Stack_1e0,ndx);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&pp_Stack_1e0,") returned ",0xb);
                std::ostream::_M_insert<unsigned_long>((ulong)&pp_Stack_1e0);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&pp_Stack_1e0," expected ",10);
                std::ostream::_M_insert<unsigned_long>((ulong)&pp_Stack_1e0);
                tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)local_1e8,(EndMessageToken *)&tcu::TestLog::EndMessage)
                ;
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_1e0);
                std::ios_base::~ios_base(local_170);
                puVar11 = (gets->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                          _M_impl.super__Vector_impl_data._M_start;
                puVar15 = (gets->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                          _M_impl.super__Vector_impl_data._M_finish;
              }
              iVar18 = iVar18 + 1;
              local_3a4 = 0;
            }
            lVar26 = lVar26 + 1;
          } while (lVar26 < (int)((ulong)((long)puVar15 - (long)puVar11) >> 2));
          if (iVar18 == 0) goto LAB_01430320;
          if (0x14 < iVar18) {
            local_1e8 = (undefined1  [8])local_3d0;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_1e0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&pp_Stack_1e0,
                       "Total number of invalid values returned by atomicCounter(counter",0x40);
            std::ostream::operator<<((ostringstream *)&pp_Stack_1e0,ndx);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pp_Stack_1e0,") ",2);
            std::ostream::operator<<((ostringstream *)&pp_Stack_1e0,iVar18);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&pp_Stack_1e0," displaying first 20 values.",0x1c);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_1e0);
            std::ios_base::~ios_base(local_170);
          }
        }
        tcu::TestLog::endSection(local_2d0.m_log);
      }
      else if ((~OVar2 & 3) == 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
        std::ostream::operator<<((MessageBuilder *)local_1e8,ndx);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8);
        std::ios_base::~ios_base(local_178);
        plVar9 = (long *)std::__cxx11::string::replace((ulong)local_3f0,0,(char *)0x0,0x1ab4dd2);
        plVar14 = plVar9 + 2;
        if ((long *)*plVar9 == plVar14) {
          local_328 = *plVar14;
          lStack_320 = plVar9[3];
          local_338 = &local_328;
        }
        else {
          local_328 = *plVar14;
          local_338 = (long *)*plVar9;
        }
        local_330 = plVar9[1];
        *plVar9 = (long)plVar14;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        plVar9 = (long *)std::__cxx11::string::append((char *)&local_338);
        plVar14 = plVar9 + 2;
        if ((long *)*plVar9 == plVar14) {
          local_370 = *plVar14;
          lStack_368 = plVar9[3];
          local_380 = &local_370;
        }
        else {
          local_370 = *plVar14;
          local_380 = (long *)*plVar9;
        }
        local_378 = plVar9[1];
        *plVar9 = (long)plVar14;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_318,(char *)local_380,(allocator<char> *)local_288);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
        std::ostream::operator<<((MessageBuilder *)local_1e8,ndx);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8);
        std::ios_base::~ios_base(local_178);
        puVar10 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)&local_358,0,(char *)0x0,0x1c43059);
        local_3c8 = &local_3b8;
        plVar9 = puVar10 + 2;
        if ((long *)*puVar10 == plVar9) {
          local_3b8 = *plVar9;
          uStack_3b0 = puVar10[3];
        }
        else {
          local_3b8 = *plVar9;
          local_3c8 = (long *)*puVar10;
        }
        local_3c0 = puVar10[1];
        *puVar10 = plVar9;
        puVar10[1] = 0;
        *(undefined1 *)(puVar10 + 2) = 0;
        plVar9 = (long *)std::__cxx11::string::append((char *)&local_3c8);
        local_3a0 = &local_390;
        plVar14 = plVar9 + 2;
        if ((long *)*plVar9 == plVar14) {
          local_390 = *plVar14;
          lStack_388 = plVar9[3];
        }
        else {
          local_390 = *plVar14;
          local_3a0 = (long *)*plVar9;
        }
        local_398 = plVar9[1];
        *plVar9 = (long)plVar14;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2f0,(char *)local_3a0,(allocator<char> *)local_1e8);
        tcu::ScopedLogSection::ScopedLogSection(&local_2d0,local_3d0,&local_318,&local_2f0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
          operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
        }
        if (local_3a0 != &local_390) {
          operator_delete(local_3a0,local_390 + 1);
        }
        if (local_3c8 != &local_3b8) {
          operator_delete(local_3c8,local_3b8 + 1);
        }
        if (local_358 != &local_348) {
          operator_delete(local_358,local_348 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_318._M_dataplus._M_p != &local_318.field_2) {
          operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
        }
        if (local_380 != &local_370) {
          operator_delete(local_380,local_370 + 1);
        }
        if (local_338 != &local_328) {
          operator_delete(local_338,local_328 + 1);
        }
        if (local_3f0[0] != local_3e0) {
          operator_delete(local_3f0[0],local_3e0[0] + 1);
        }
        iVar18 = (this->m_spec).threadCount * (this->m_spec).callCount;
        uVar8 = iVar18 + 1;
        uVar13 = 0;
        iVar25 = 0;
        local_230 = uVar8;
        if ((this->m_spec).useBranches == true) {
          local_230 = (iVar18 + uVar8) - iVar18 / 2;
          iVar25 = -(iVar18 / 2);
        }
        local_1e8 = (undefined1  [8])0x0;
        pp_Stack_1e0 = (_func_int **)0x0;
        local_1d8 = (pointer)0x0;
        local_318.field_2._M_allocated_capacity = 0;
        local_318._M_dataplus._M_p = (pointer)0x0;
        local_318._M_string_length = 0;
        uVar19 = (uint)((ulong)((long)local_248.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_248.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 2);
        if ((int)uVar19 < 1) {
          uVar22 = 0xffffffff;
        }
        else {
          uVar21 = 0;
          uVar22 = 0xffffffff;
          uVar13 = 0;
          do {
            uVar3 = local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar21];
            uVar12 = uVar22;
            if (uVar3 < uVar22) {
              uVar12 = uVar3;
            }
            uVar7 = uVar3;
            if (uVar3 < uVar13) {
              uVar7 = uVar13;
            }
            if (uVar3 == 0xffffffff) {
              uVar12 = uVar22;
              uVar7 = uVar13;
            }
            uVar13 = uVar7;
            uVar22 = uVar12;
            uVar21 = uVar21 + 1;
          } while ((uVar19 & 0x7fffffff) != uVar21);
        }
        uVar19 = (uint)((ulong)((long)local_268.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_268.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 2);
        if (0 < (int)uVar19) {
          uVar21 = 0;
          do {
            uVar3 = local_268.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar21];
            uVar12 = uVar22;
            if (uVar3 < uVar22) {
              uVar12 = uVar3;
            }
            uVar7 = uVar3;
            if (uVar3 < uVar13) {
              uVar7 = uVar13;
            }
            if (uVar3 == 0xffffffff) {
              uVar12 = uVar22;
              uVar7 = uVar13;
            }
            uVar13 = uVar7;
            uVar22 = uVar12;
            uVar21 = uVar21 + 1;
          } while ((uVar19 & 0x7fffffff) != uVar21);
        }
        if (uVar8 <= uVar22) {
          uVar22 = uVar8;
        }
        if (uVar13 <= uVar8) {
          uVar13 = uVar8;
        }
        uVar21 = (ulong)((uVar13 - uVar22) + 1);
        local_380 = (long *)((ulong)local_380 & 0xffffffff00000000);
        local_22c = ndx;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1e8,uVar21,
                   (value_type_conflict4 *)&local_380);
        local_380 = (long *)((ulong)local_380 & 0xffffffff00000000);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_318,uVar21,
                   (value_type_conflict4 *)&local_380);
        ndx = local_22c;
        uVar13 = (uint)((ulong)((long)local_248.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_248.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 2);
        if (0 < (int)uVar13) {
          uVar21 = 0;
          do {
            if (local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar21] != 0xffffffff) {
              piVar23 = (int *)((long)(qpTestLog **)local_1e8 +
                               (ulong)(local_248.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_start[uVar21] - uVar22) *
                               4);
              *piVar23 = *piVar23 + 1;
            }
            uVar21 = uVar21 + 1;
          } while ((uVar13 & 0x7fffffff) != uVar21);
        }
        uVar13 = (uint)((ulong)((long)local_268.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_268.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 2);
        if (0 < (int)uVar13) {
          uVar21 = 0;
          do {
            if (local_268.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar21] != 0xffffffff) {
              *(int *)(local_318._M_dataplus._M_p +
                      (ulong)(local_268.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start[uVar21] - uVar22) * 4) =
                   *(int *)(local_318._M_dataplus._M_p +
                           (ulong)(local_268.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start[uVar21] - uVar22) * 4) +
                   1;
            }
            uVar21 = uVar21 + 1;
          } while ((uVar13 & 0x7fffffff) != uVar21);
        }
        iVar18 = uVar8 - uVar22;
        while( true ) {
          lVar26 = (long)iVar18;
          iVar4 = *(int *)((long)(qpTestLog **)local_1e8 + lVar26 * 4);
          iVar5 = *(int *)(local_318._M_dataplus._M_p + lVar26 * 4);
          uVar8 = (uint)((ulong)((long)pp_Stack_1e0 - (long)local_1e8) >> 2);
          if (iVar4 + iVar5 == 0) break;
          if (iVar4 == 0) {
            iVar24 = -1;
            piVar23 = (int *)(local_318._M_dataplus._M_p + lVar26 * 4);
            iVar20 = iVar5;
            if (iVar5 != 0) goto LAB_0143092a;
          }
          else {
            piVar1 = (int *)((long)(qpTestLog **)local_1e8 + lVar26 * 4);
            iVar24 = 1;
            piVar23 = piVar1;
            iVar20 = iVar4;
            if ((iVar18 < (int)((iVar25 + local_230) - uVar22)) &&
               (iVar24 = -1, piVar23 = (int *)(local_318._M_dataplus._M_p + lVar26 * 4),
               iVar20 = iVar5, iVar5 == 0)) {
              iVar24 = 1;
              piVar23 = piVar1;
              iVar20 = iVar4;
            }
LAB_0143092a:
            *piVar23 = iVar20 + -1;
            iVar18 = iVar18 + iVar24;
          }
          if ((iVar18 < 0) || ((int)uVar8 <= iVar18)) break;
        }
        bVar27 = iVar18 + uVar22 == iVar25 + local_230;
        if (0 < (int)uVar8) {
          uVar21 = 0;
          do {
            bVar27 = (bool)(bVar27 & *(int *)((long)(qpTestLog **)local_1e8 + uVar21 * 4) == 0);
            uVar21 = uVar21 + 1;
          } while ((uVar8 & 0x7fffffff) != uVar21);
        }
        uVar8 = (uint)(local_318._M_string_length - (long)local_318._M_dataplus._M_p >> 2);
        if ((int)uVar8 < 1) {
          if (local_318._M_dataplus._M_p != (pointer)0x0) goto LAB_014309c0;
        }
        else {
          uVar21 = 0;
          do {
            bVar27 = (bool)(bVar27 & *(int *)(local_318._M_dataplus._M_p + uVar21 * 4) == 0);
            uVar21 = uVar21 + 1;
          } while ((uVar8 & 0x7fffffff) != uVar21);
LAB_014309c0:
          operator_delete(local_318._M_dataplus._M_p,
                          local_318.field_2._M_allocated_capacity - (long)local_318._M_dataplus._M_p
                         );
        }
        if (local_1e8 != (undefined1  [8])0x0) {
          operator_delete((void *)local_1e8,(long)local_1d8 - (long)local_1e8);
        }
        if (bVar27) {
          local_1e8 = (undefined1  [8])local_3d0;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_1e0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pp_Stack_1e0,
                     "Found possible order of calls to atomicCounterIncrement(counter",0x3f);
          std::ostream::operator<<((ostringstream *)&pp_Stack_1e0,ndx);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pp_Stack_1e0,") and atomicCounterDecrement(counter",0x24);
          std::ostream::operator<<((ostringstream *)&pp_Stack_1e0,ndx);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pp_Stack_1e0,").",2);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_1e0);
          std::ios_base::~ios_base(local_170);
        }
        else {
          local_1e8 = (undefined1  [8])local_3d0;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_1e0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pp_Stack_1e0,
                     "No possible order of calls to atomicCounterIncrement(counter",0x3c);
          std::ostream::operator<<((ostringstream *)&pp_Stack_1e0,ndx);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pp_Stack_1e0,") and atomicCounterDecrement(counter",0x24);
          std::ostream::operator<<((ostringstream *)&pp_Stack_1e0,ndx);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pp_Stack_1e0,") found.",8);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_1e0);
          std::ios_base::~ios_base(local_170);
          local_3a4 = 0;
        }
        tcu::TestLog::endSection(local_2d0.m_log);
      }
      else if ((OVar2 & OPERATION_INC) == 0) {
        if ((OVar2 & OPERATION_DEC) != 0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
          std::ostream::operator<<((MessageBuilder *)local_1e8,ndx);
          std::__cxx11::stringbuf::str();
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8);
          std::ios_base::~ios_base(local_178);
          plVar9 = (long *)std::__cxx11::string::replace((ulong)local_3f0,0,(char *)0x0,0x1ab4dd2);
          plVar14 = plVar9 + 2;
          if ((long *)*plVar9 == plVar14) {
            local_328 = *plVar14;
            lStack_320 = plVar9[3];
            local_338 = &local_328;
          }
          else {
            local_328 = *plVar14;
            local_338 = (long *)*plVar9;
          }
          local_330 = plVar9[1];
          *plVar9 = (long)plVar14;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          plVar9 = (long *)std::__cxx11::string::append((char *)&local_338);
          plVar14 = plVar9 + 2;
          if ((long *)*plVar9 == plVar14) {
            local_370 = *plVar14;
            lStack_368 = plVar9[3];
            local_380 = &local_370;
          }
          else {
            local_370 = *plVar14;
            local_380 = (long *)*plVar9;
          }
          local_378 = plVar9[1];
          *plVar9 = (long)plVar14;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_318,(char *)local_380,(allocator<char> *)local_288);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
          std::ostream::operator<<((MessageBuilder *)local_1e8,ndx);
          std::__cxx11::stringbuf::str();
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8);
          std::ios_base::~ios_base(local_178);
          puVar10 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_358,0,(char *)0x0,0x1c42f9c);
          local_3c8 = &local_3b8;
          plVar9 = puVar10 + 2;
          if ((long *)*puVar10 == plVar9) {
            local_3b8 = *plVar9;
            uStack_3b0 = puVar10[3];
          }
          else {
            local_3b8 = *plVar9;
            local_3c8 = (long *)*puVar10;
          }
          local_3c0 = puVar10[1];
          *puVar10 = plVar9;
          puVar10[1] = 0;
          *(undefined1 *)(puVar10 + 2) = 0;
          plVar9 = (long *)std::__cxx11::string::append((char *)&local_3c8);
          local_3a0 = &local_390;
          plVar14 = plVar9 + 2;
          if ((long *)*plVar9 == plVar14) {
            local_390 = *plVar14;
            lStack_388 = plVar9[3];
          }
          else {
            local_390 = *plVar14;
            local_3a0 = (long *)*plVar9;
          }
          local_398 = plVar9[1];
          *plVar9 = (long)plVar14;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_2f0,(char *)local_3a0,(allocator<char> *)local_1e8);
          tcu::ScopedLogSection::ScopedLogSection(&local_2d0,local_3d0,&local_318,&local_2f0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
            operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
          }
          if (local_3a0 != &local_390) {
            operator_delete(local_3a0,local_390 + 1);
          }
          if (local_3c8 != &local_3b8) {
            operator_delete(local_3c8,local_3b8 + 1);
          }
          if (local_358 != &local_348) {
            operator_delete(local_358,local_348 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_318._M_dataplus._M_p != &local_318.field_2) {
            operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
          }
          if (local_380 != &local_370) {
            operator_delete(local_380,local_370 + 1);
          }
          if (local_338 != &local_328) {
            operator_delete(local_338,local_328 + 1);
          }
          if (local_3f0[0] != local_3e0) {
            operator_delete(local_3f0[0],local_3e0[0] + 1);
          }
          bVar27 = checkUniquenessAndLinearity(local_3d0,&local_268);
          if (bVar27) {
            local_1e8 = (undefined1  [8])local_3d0;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_1e0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&pp_Stack_1e0,"atomicCounterDecrement(counter",0x1e);
            std::ostream::operator<<((ostringstream *)&pp_Stack_1e0,ndx);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&pp_Stack_1e0,") returned only unique values.",0x1e);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_1e0);
            std::ios_base::~ios_base(local_170);
          }
          else {
            local_1e8 = (undefined1  [8])local_3d0;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_1e0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&pp_Stack_1e0,"atomicCounterDecrement(counter",0x1e);
            std::ostream::operator<<((ostringstream *)&pp_Stack_1e0,ndx);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&pp_Stack_1e0,") returned non unique values.",0x1d);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_1e0);
            std::ios_base::~ios_base(local_170);
            local_3a4 = 0;
          }
          tcu::TestLog::endSection(local_2d0.m_log);
          if (((local_3a4 & 1) != 0) && (((this->m_spec).operations & OPERATION_GET) != 0)) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
            std::ostream::operator<<((MessageBuilder *)local_1e8,ndx);
            std::__cxx11::stringbuf::str();
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8);
            std::ios_base::~ios_base(local_178);
            plVar9 = (long *)std::__cxx11::string::replace((ulong)local_3f0,0,(char *)0x0,0x1ab4dd2)
            ;
            plVar14 = plVar9 + 2;
            if ((long *)*plVar9 == plVar14) {
              local_328 = *plVar14;
              lStack_320 = plVar9[3];
              local_338 = &local_328;
            }
            else {
              local_328 = *plVar14;
              local_338 = (long *)*plVar9;
            }
            local_330 = plVar9[1];
            *plVar9 = (long)plVar14;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            plVar9 = (long *)std::__cxx11::string::append((char *)&local_338);
            plVar14 = plVar9 + 2;
            if ((long *)*plVar9 == plVar14) {
              local_370 = *plVar14;
              lStack_368 = plVar9[3];
              local_380 = &local_370;
            }
            else {
              local_370 = *plVar14;
              local_380 = (long *)*plVar9;
            }
            local_378 = plVar9[1];
            *plVar9 = (long)plVar14;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_318,(char *)local_380,&local_359);
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
            std::ostream::operator<<((MessageBuilder *)local_1e8,ndx);
            std::__cxx11::stringbuf::str();
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8);
            std::ios_base::~ios_base(local_178);
            plVar9 = (long *)std::__cxx11::string::replace((ulong)local_288,0,(char *)0x0,0x1c42f9c)
            ;
            local_2d0.m_log = &local_2c0;
            pTVar16 = (TestLog *)(plVar9 + 2);
            if ((TestLog *)*plVar9 == pTVar16) {
              local_2c0.m_log = pTVar16->m_log;
              lStack_2b8 = plVar9[3];
            }
            else {
              local_2c0.m_log = pTVar16->m_log;
              local_2d0.m_log = (TestLog *)*plVar9;
            }
            local_2c8 = plVar9[1];
            *plVar9 = (long)pTVar16;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            plVar9 = (long *)std::__cxx11::string::append((char *)&local_2d0);
            local_358 = &local_348;
            puVar17 = (ulong *)(plVar9 + 2);
            if ((ulong *)*plVar9 == puVar17) {
              local_348 = *puVar17;
              lStack_340 = plVar9[3];
            }
            else {
              local_348 = *puVar17;
              local_358 = (ulong *)*plVar9;
            }
            local_350 = plVar9[1];
            *plVar9 = (long)puVar17;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
            std::ostream::operator<<((MessageBuilder *)local_1e8,ndx);
            std::__cxx11::stringbuf::str();
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8);
            std::ios_base::~ios_base(local_178);
            uVar21 = 0xf;
            if (local_358 != &local_348) {
              uVar21 = local_348;
            }
            if (uVar21 < (ulong)(local_2a8 + local_350)) {
              uVar21 = 0xf;
              if (local_2b0 != local_2a0) {
                uVar21 = local_2a0[0];
              }
              if (uVar21 < (ulong)(local_2a8 + local_350)) goto LAB_01431d11;
              puVar10 = (undefined8 *)
                        std::__cxx11::string::replace
                                  ((ulong)&local_2b0,0,(char *)0x0,(ulong)local_358);
            }
            else {
LAB_01431d11:
              puVar10 = (undefined8 *)
                        std::__cxx11::string::_M_append((char *)&local_358,(ulong)local_2b0);
            }
            local_3c8 = &local_3b8;
            plVar9 = puVar10 + 2;
            if ((long *)*puVar10 == plVar9) {
              local_3b8 = *plVar9;
              uStack_3b0 = puVar10[3];
            }
            else {
              local_3b8 = *plVar9;
              local_3c8 = (long *)*puVar10;
            }
            local_3c0 = puVar10[1];
            *puVar10 = plVar9;
            puVar10[1] = 0;
            *(undefined1 *)plVar9 = 0;
            plVar9 = (long *)std::__cxx11::string::append((char *)&local_3c8);
            local_3a0 = &local_390;
            plVar14 = plVar9 + 2;
            if ((long *)*plVar9 == plVar14) {
              local_390 = *plVar14;
              lStack_388 = plVar9[3];
            }
            else {
              local_390 = *plVar14;
              local_3a0 = (long *)*plVar9;
            }
            local_398 = plVar9[1];
            *plVar9 = (long)plVar14;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_2f0,(char *)local_3a0,(allocator<char> *)local_1e8);
            tcu::ScopedLogSection::ScopedLogSection(&local_290,local_3d0,&local_318,&local_2f0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
              operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_3a0 != &local_390) {
              operator_delete(local_3a0,local_390 + 1);
            }
            if (local_3c8 != &local_3b8) {
              operator_delete(local_3c8,local_3b8 + 1);
            }
            if (local_2b0 != local_2a0) {
              operator_delete(local_2b0,local_2a0[0] + 1);
            }
            if (local_358 != &local_348) {
              operator_delete(local_358,local_348 + 1);
            }
            if (local_2d0.m_log != &local_2c0) {
              operator_delete(local_2d0.m_log,(ulong)((long)&(local_2c0.m_log)->flags + 1));
            }
            if (local_288[0] != local_278) {
              operator_delete(local_288[0],local_278[0] + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_318._M_dataplus._M_p != &local_318.field_2) {
              operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_380 != &local_370) {
              operator_delete(local_380,local_370 + 1);
            }
            if (local_338 != &local_328) {
              operator_delete(local_338,local_328 + 1);
            }
            if (local_3f0[0] != local_3e0) {
              operator_delete(local_3f0[0],local_3e0[0] + 1);
            }
            bVar27 = checkRange(local_3d0,&local_268,&local_228,&local_208);
            if (bVar27) {
              local_1e8 = (undefined1  [8])local_3d0;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_1e0);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&pp_Stack_1e0,"atomicCounterDecrement(counter",0x1e);
              std::ostream::operator<<((ostringstream *)&pp_Stack_1e0,ndx);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&pp_Stack_1e0,
                         ") returned only values between previous and next call to atomicCounter(counter"
                         ,0x4e);
              std::ostream::operator<<((ostringstream *)&pp_Stack_1e0,ndx);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pp_Stack_1e0,").",2);
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_1e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_1e0);
              std::ios_base::~ios_base(local_170);
            }
            else {
              local_1e8 = (undefined1  [8])local_3d0;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_1e0);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&pp_Stack_1e0,"atomicCounterDecrement(counter",0x1e);
              std::ostream::operator<<((ostringstream *)&pp_Stack_1e0,ndx);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&pp_Stack_1e0,
                         ") returned value that is not between previous and next call to atomicCounter(counter"
                         ,0x54);
              std::ostream::operator<<((ostringstream *)&pp_Stack_1e0,ndx);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pp_Stack_1e0,").",2);
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_1e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_1e0);
              std::ios_base::~ios_base(local_170);
              local_3a4 = 0;
            }
            tcu::TestLog::endSection(local_290.m_log);
          }
        }
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
        std::ostream::operator<<((MessageBuilder *)local_1e8,ndx);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8);
        std::ios_base::~ios_base(local_178);
        plVar9 = (long *)std::__cxx11::string::replace((ulong)local_3f0,0,(char *)0x0,0x1ab4dd2);
        plVar14 = plVar9 + 2;
        if ((long *)*plVar9 == plVar14) {
          local_328 = *plVar14;
          lStack_320 = plVar9[3];
          local_338 = &local_328;
        }
        else {
          local_328 = *plVar14;
          local_338 = (long *)*plVar9;
        }
        local_330 = plVar9[1];
        *plVar9 = (long)plVar14;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        plVar9 = (long *)std::__cxx11::string::append((char *)&local_338);
        plVar14 = plVar9 + 2;
        if ((long *)*plVar9 == plVar14) {
          local_370 = *plVar14;
          lStack_368 = plVar9[3];
          local_380 = &local_370;
        }
        else {
          local_370 = *plVar14;
          local_380 = (long *)*plVar9;
        }
        local_378 = plVar9[1];
        *plVar9 = (long)plVar14;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_318,(char *)local_380,(allocator<char> *)local_288);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
        std::ostream::operator<<((MessageBuilder *)local_1e8,ndx);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8);
        std::ios_base::~ios_base(local_178);
        puVar10 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)&local_358,0,(char *)0x0,0x1c42f9c);
        local_3c8 = &local_3b8;
        plVar9 = puVar10 + 2;
        if ((long *)*puVar10 == plVar9) {
          local_3b8 = *plVar9;
          uStack_3b0 = puVar10[3];
        }
        else {
          local_3b8 = *plVar9;
          local_3c8 = (long *)*puVar10;
        }
        local_3c0 = puVar10[1];
        *puVar10 = plVar9;
        puVar10[1] = 0;
        *(undefined1 *)(puVar10 + 2) = 0;
        plVar9 = (long *)std::__cxx11::string::append((char *)&local_3c8);
        local_3a0 = &local_390;
        plVar14 = plVar9 + 2;
        if ((long *)*plVar9 == plVar14) {
          local_390 = *plVar14;
          lStack_388 = plVar9[3];
        }
        else {
          local_390 = *plVar14;
          local_3a0 = (long *)*plVar9;
        }
        local_398 = plVar9[1];
        *plVar9 = (long)plVar14;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2f0,(char *)local_3a0,(allocator<char> *)local_1e8);
        tcu::ScopedLogSection::ScopedLogSection(&local_2d0,local_3d0,&local_318,&local_2f0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
          operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
        }
        if (local_3a0 != &local_390) {
          operator_delete(local_3a0,local_390 + 1);
        }
        if (local_3c8 != &local_3b8) {
          operator_delete(local_3c8,local_3b8 + 1);
        }
        if (local_358 != &local_348) {
          operator_delete(local_358,local_348 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_318._M_dataplus._M_p != &local_318.field_2) {
          operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
        }
        if (local_380 != &local_370) {
          operator_delete(local_380,local_370 + 1);
        }
        if (local_338 != &local_328) {
          operator_delete(local_338,local_328 + 1);
        }
        if (local_3f0[0] != local_3e0) {
          operator_delete(local_3f0[0],local_3e0[0] + 1);
        }
        bVar27 = checkUniquenessAndLinearity(local_3d0,&local_248);
        if (bVar27) {
          local_1e8 = (undefined1  [8])local_3d0;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_1e0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pp_Stack_1e0,"atomicCounterIncrement(counter",0x1e);
          std::ostream::operator<<((ostringstream *)&pp_Stack_1e0,ndx);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pp_Stack_1e0,") returned only unique values.",0x1e);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_1e0);
          std::ios_base::~ios_base(local_170);
        }
        else {
          local_1e8 = (undefined1  [8])local_3d0;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_1e0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pp_Stack_1e0,"atomicCounterIncrement(counter",0x1e);
          std::ostream::operator<<((ostringstream *)&pp_Stack_1e0,ndx);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pp_Stack_1e0,") returned non unique values.",0x1d);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_1e0);
          std::ios_base::~ios_base(local_170);
          local_3a4 = 0;
        }
        tcu::TestLog::endSection(local_2d0.m_log);
        if (((local_3a4 & 1) == 0) || (((this->m_spec).operations & OPERATION_GET) == 0))
        goto LAB_014320e6;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
        std::ostream::operator<<((MessageBuilder *)local_1e8,ndx);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8);
        std::ios_base::~ios_base(local_178);
        plVar9 = (long *)std::__cxx11::string::replace((ulong)local_3f0,0,(char *)0x0,0x1ab4dd2);
        plVar14 = plVar9 + 2;
        if ((long *)*plVar9 == plVar14) {
          local_328 = *plVar14;
          lStack_320 = plVar9[3];
          local_338 = &local_328;
        }
        else {
          local_328 = *plVar14;
          local_338 = (long *)*plVar9;
        }
        local_330 = plVar9[1];
        *plVar9 = (long)plVar14;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        plVar9 = (long *)std::__cxx11::string::append((char *)&local_338);
        plVar14 = plVar9 + 2;
        if ((long *)*plVar9 == plVar14) {
          local_370 = *plVar14;
          lStack_368 = plVar9[3];
          local_380 = &local_370;
        }
        else {
          local_370 = *plVar14;
          local_380 = (long *)*plVar9;
        }
        local_378 = plVar9[1];
        *plVar9 = (long)plVar14;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_318,(char *)local_380,&local_359);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
        std::ostream::operator<<((MessageBuilder *)local_1e8,ndx);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8);
        std::ios_base::~ios_base(local_178);
        plVar9 = (long *)std::__cxx11::string::replace((ulong)local_288,0,(char *)0x0,0x1c42f9c);
        local_2d0.m_log = &local_2c0;
        pTVar16 = (TestLog *)(plVar9 + 2);
        if ((TestLog *)*plVar9 == pTVar16) {
          local_2c0.m_log = pTVar16->m_log;
          lStack_2b8 = plVar9[3];
        }
        else {
          local_2c0.m_log = pTVar16->m_log;
          local_2d0.m_log = (TestLog *)*plVar9;
        }
        local_2c8 = plVar9[1];
        *plVar9 = (long)pTVar16;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        plVar9 = (long *)std::__cxx11::string::append((char *)&local_2d0);
        local_358 = &local_348;
        puVar17 = (ulong *)(plVar9 + 2);
        if ((ulong *)*plVar9 == puVar17) {
          local_348 = *puVar17;
          lStack_340 = plVar9[3];
        }
        else {
          local_348 = *puVar17;
          local_358 = (ulong *)*plVar9;
        }
        local_350 = plVar9[1];
        *plVar9 = (long)puVar17;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
        std::ostream::operator<<((MessageBuilder *)local_1e8,ndx);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8);
        std::ios_base::~ios_base(local_178);
        uVar21 = 0xf;
        if (local_358 != &local_348) {
          uVar21 = local_348;
        }
        if (uVar21 < (ulong)(local_2a8 + local_350)) {
          uVar21 = 0xf;
          if (local_2b0 != local_2a0) {
            uVar21 = local_2a0[0];
          }
          if (uVar21 < (ulong)(local_2a8 + local_350)) goto LAB_014316da;
          puVar10 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_2b0,0,(char *)0x0,(ulong)local_358);
        }
        else {
LAB_014316da:
          puVar10 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_358,(ulong)local_2b0);
        }
        local_3c8 = &local_3b8;
        plVar9 = puVar10 + 2;
        if ((long *)*puVar10 == plVar9) {
          local_3b8 = *plVar9;
          uStack_3b0 = puVar10[3];
        }
        else {
          local_3b8 = *plVar9;
          local_3c8 = (long *)*puVar10;
        }
        local_3c0 = puVar10[1];
        *puVar10 = plVar9;
        puVar10[1] = 0;
        *(undefined1 *)plVar9 = 0;
        plVar9 = (long *)std::__cxx11::string::append((char *)&local_3c8);
        local_3a0 = &local_390;
        plVar14 = plVar9 + 2;
        if ((long *)*plVar9 == plVar14) {
          local_390 = *plVar14;
          lStack_388 = plVar9[3];
        }
        else {
          local_390 = *plVar14;
          local_3a0 = (long *)*plVar9;
        }
        local_398 = plVar9[1];
        *plVar9 = (long)plVar14;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2f0,(char *)local_3a0,(allocator<char> *)local_1e8);
        tcu::ScopedLogSection::ScopedLogSection(&local_290,local_3d0,&local_318,&local_2f0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
          operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
        }
        if (local_3a0 != &local_390) {
          operator_delete(local_3a0,local_390 + 1);
        }
        if (local_3c8 != &local_3b8) {
          operator_delete(local_3c8,local_3b8 + 1);
        }
        if (local_2b0 != local_2a0) {
          operator_delete(local_2b0,local_2a0[0] + 1);
        }
        if (local_358 != &local_348) {
          operator_delete(local_358,local_348 + 1);
        }
        if (local_2d0.m_log != &local_2c0) {
          operator_delete(local_2d0.m_log,(ulong)((long)&(local_2c0.m_log)->flags + 1));
        }
        if (local_288[0] != local_278) {
          operator_delete(local_288[0],local_278[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_318._M_dataplus._M_p != &local_318.field_2) {
          operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
        }
        if (local_380 != &local_370) {
          operator_delete(local_380,local_370 + 1);
        }
        if (local_338 != &local_328) {
          operator_delete(local_338,local_328 + 1);
        }
        if (local_3f0[0] != local_3e0) {
          operator_delete(local_3f0[0],local_3e0[0] + 1);
        }
        bVar27 = checkRange(local_3d0,&local_248,&local_208,&local_228);
        if (bVar27) {
          local_1e8 = (undefined1  [8])local_3d0;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_1e0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pp_Stack_1e0,"atomicCounterIncrement(counter",0x1e);
          std::ostream::operator<<((ostringstream *)&pp_Stack_1e0,ndx);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pp_Stack_1e0,
                     ") returned only values between previous and next call to atomicCounter(counter"
                     ,0x4e);
          std::ostream::operator<<((ostringstream *)&pp_Stack_1e0,ndx);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pp_Stack_1e0,").",2);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_1e0);
          std::ios_base::~ios_base(local_170);
        }
        else {
          local_1e8 = (undefined1  [8])local_3d0;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_1e0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pp_Stack_1e0,"atomicCounterIncrement(counter",0x1e);
          std::ostream::operator<<((ostringstream *)&pp_Stack_1e0,ndx);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pp_Stack_1e0,
                     ") returned value that is not between previous and next call to atomicCounter(counter"
                     ,0x54);
          std::ostream::operator<<((ostringstream *)&pp_Stack_1e0,ndx);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pp_Stack_1e0,").",2);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_1e0);
          std::ios_base::~ios_base(local_170);
          local_3a4 = 0;
        }
        tcu::TestLog::endSection(local_290.m_log);
      }
LAB_014320e6:
      if (local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_68.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_68.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_228.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_228.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_228.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_228.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_208.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_208.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_208.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_208.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_268.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_268.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_268.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_268.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_248.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_248.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      ndx = ndx + 1;
      iVar18 = (this->m_spec).atomicCounterCount;
    } while (ndx < iVar18);
    bVar6 = (byte)local_3a4;
  }
  return (bool)(bVar6 & 1);
}

Assistant:

bool AtomicCounterTest::checkAndLogCallValues (TestLog& log, const vector<deUint32>& increments, const vector<deUint32>& decrements, const vector<deUint32>& preGets, const vector<deUint32>& postGets, const vector<deUint32>& gets) const
{
	bool isOk = true;

	for (int counterNdx = 0; counterNdx < m_spec.atomicCounterCount; counterNdx++)
	{
		vector<deUint32> counterIncrements;
		vector<deUint32> counterDecrements;
		vector<deUint32> counterPreGets;
		vector<deUint32> counterPostGets;
		vector<deUint32> counterGets;

		getCountersValues(counterIncrements,	increments,	counterNdx, m_spec.atomicCounterCount);
		getCountersValues(counterDecrements,	decrements,	counterNdx, m_spec.atomicCounterCount);
		getCountersValues(counterPreGets,		preGets,	counterNdx, m_spec.atomicCounterCount);
		getCountersValues(counterPostGets,		postGets,	counterNdx, m_spec.atomicCounterCount);
		getCountersValues(counterGets,			gets,		counterNdx, m_spec.atomicCounterCount);

		if (m_spec.operations == OPERATION_GET)
		{
			tcu::ScopedLogSection valueCheck(log, ("counter" + de::toString(counterNdx) + " value check").c_str(), ("Check that counter" + de::toString(counterNdx) + " values haven't changed.").c_str());
			int changedValues = 0;

			for (int valueNdx = 0; valueNdx < (int)gets.size(); valueNdx++)
			{
				if ((!m_spec.useBranches || gets[valueNdx] != (deUint32)-1) && gets[valueNdx] != getInitialValue())
				{
					if (changedValues < 20)
						log << TestLog::Message << "atomicCounter(counter" << counterNdx << ") returned " << gets[valueNdx] << " expected " << getInitialValue() << TestLog::EndMessage;
					isOk = false;
					changedValues++;
				}
			}

			if (changedValues == 0)
				log << TestLog::Message << "All values returned by atomicCounter(counter" << counterNdx << ") match initial value " << getInitialValue() <<  "." << TestLog::EndMessage;
			else if (changedValues > 20)
				log << TestLog::Message << "Total number of invalid values returned by atomicCounter(counter" << counterNdx << ") " << changedValues << " displaying first 20 values." <<  TestLog::EndMessage;
		}
		else if ((m_spec.operations & (OPERATION_INC|OPERATION_DEC)) == (OPERATION_INC|OPERATION_DEC))
		{
			tcu::ScopedLogSection valueCheck(log, ("counter" + de::toString(counterNdx) + " path check").c_str(), ("Check that there is order in which counter" + de::toString(counterNdx) + " increments and decrements could have happened.").c_str());
			if (!checkPath(counterIncrements, counterDecrements, getInitialValue(), m_spec))
			{
				isOk = false;
				log << TestLog::Message << "No possible order of calls to atomicCounterIncrement(counter" << counterNdx << ") and atomicCounterDecrement(counter" << counterNdx << ") found." << TestLog::EndMessage;
			}
			else
				log << TestLog::Message << "Found possible order of calls to atomicCounterIncrement(counter" << counterNdx << ") and atomicCounterDecrement(counter" << counterNdx << ")." << TestLog::EndMessage;
		}
		else if ((m_spec.operations & OPERATION_INC) != 0)
		{
			{
				tcu::ScopedLogSection uniquenesCheck(log, ("counter" + de::toString(counterNdx) + " check uniqueness and linearity").c_str(), ("Check that counter" + de::toString(counterNdx) + " returned only unique and linear values.").c_str());

				if (!checkUniquenessAndLinearity(log, counterIncrements))
				{
					isOk = false;
					log << TestLog::Message << "atomicCounterIncrement(counter" << counterNdx << ") returned non unique values." << TestLog::EndMessage;
				}
				else
					log << TestLog::Message << "atomicCounterIncrement(counter" << counterNdx << ") returned only unique values." << TestLog::EndMessage;
			}

			if (isOk && ((m_spec.operations & OPERATION_GET) != 0))
			{
				tcu::ScopedLogSection uniquenesCheck(log, ("counter" + de::toString(counterNdx) + " check range").c_str(), ("Check that counter" + de::toString(counterNdx) + " returned only values values between previous and next atomicCounter(counter" + de::toString(counterNdx) + ").").c_str());

				if (!checkRange(log, counterIncrements, counterPreGets, counterPostGets))
				{
					isOk = false;
					log << TestLog::Message << "atomicCounterIncrement(counter" << counterNdx << ") returned value that is not between previous and next call to atomicCounter(counter" << counterNdx << ")." << TestLog::EndMessage;
				}
				else
					log << TestLog::Message << "atomicCounterIncrement(counter" << counterNdx << ") returned only values between previous and next call to atomicCounter(counter" << counterNdx << ")." << TestLog::EndMessage;
			}
		}
		else if ((m_spec.operations & OPERATION_DEC) != 0)
		{
			{
				tcu::ScopedLogSection uniquenesCheck(log, ("counter" + de::toString(counterNdx) + " check uniqueness and linearity").c_str(), ("Check that counter" + de::toString(counterNdx) + " returned only unique and linear values.").c_str());

				if (!checkUniquenessAndLinearity(log, counterDecrements))
				{
					isOk = false;
					log << TestLog::Message << "atomicCounterDecrement(counter" << counterNdx << ") returned non unique values." << TestLog::EndMessage;
				}
				else
					log << TestLog::Message << "atomicCounterDecrement(counter" << counterNdx << ") returned only unique values." << TestLog::EndMessage;
			}

			if (isOk && ((m_spec.operations & OPERATION_GET) != 0))
			{
				tcu::ScopedLogSection uniquenesCheck(log, ("counter" + de::toString(counterNdx) + " check range").c_str(), ("Check that counter" + de::toString(counterNdx) + " returned only values values between previous and next atomicCounter(counter" + de::toString(counterNdx) + ".").c_str());

				if (!checkRange(log, counterDecrements, counterPostGets, counterPreGets))
				{
					isOk = false;
					log << TestLog::Message << "atomicCounterDecrement(counter" << counterNdx << ") returned value that is not between previous and next call to atomicCounter(counter" << counterNdx << ")." << TestLog::EndMessage;
				}
				else
					log << TestLog::Message << "atomicCounterDecrement(counter" << counterNdx << ") returned only values between previous and next call to atomicCounter(counter" << counterNdx << ")." << TestLog::EndMessage;
			}
		}
	}

	return isOk;
}